

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode canon_string(char *q,size_t len,dynbuf *dq,_Bool *found_equals)

{
  char cVar1;
  int iVar2;
  undefined2 local_4b;
  char local_49;
  char acStack_48 [5];
  char out [3];
  char hex [17];
  undefined2 local_2f;
  char local_2d;
  CURLcode local_2c;
  char tmp [3];
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *found_equals_local;
  dynbuf *dq_local;
  size_t len_local;
  char *q_local;
  
  p_Stack_28 = found_equals;
  local_2c = CURLE_OK;
  dq_local = (dynbuf *)len;
  len_local = (size_t)q;
  do {
    if (dq_local == (dynbuf *)0x0 || local_2c != CURLE_OK) {
      return local_2c;
    }
    if ((((*(char *)len_local < '0') || ('9' < *(char *)len_local)) &&
        ((*(char *)len_local < 'a' || ('z' < *(char *)len_local)))) &&
       ((*(char *)len_local < 'A' || ('Z' < *(char *)len_local)))) {
      iVar2 = (int)*(char *)len_local;
      if (iVar2 == 0x25) {
        if (((((*(char *)(len_local + 1) < '0') || ('9' < *(char *)(len_local + 1))) &&
             ((*(char *)(len_local + 1) < 'a' || ('f' < *(char *)(len_local + 1))))) &&
            ((*(char *)(len_local + 1) < 'A' || ('F' < *(char *)(len_local + 1))))) ||
           (((*(char *)(len_local + 2) < '0' || ('9' < *(char *)(len_local + 2))) &&
            (((*(char *)(len_local + 2) < 'a' || ('f' < *(char *)(len_local + 2))) &&
             ((*(char *)(len_local + 2) < 'A' || ('F' < *(char *)(len_local + 2))))))))) {
          local_2c = Curl_dyn_addn(dq,"%25",3);
        }
        else {
          local_2f = 0x25;
          local_2d = 0;
          cVar1 = Curl_raw_toupper(*(char *)(len_local + 1));
          local_2f = CONCAT11(cVar1,(undefined1)local_2f);
          local_2d = Curl_raw_toupper(*(char *)(len_local + 2));
          local_2c = Curl_dyn_addn(dq,&local_2f,3);
          len_local = len_local + 2;
          dq_local = (dynbuf *)((long)&dq_local[-1].toobig + 6);
        }
      }
      else if (((iVar2 - 0x2dU < 2) || (iVar2 == 0x5f)) || (iVar2 == 0x7e)) {
        local_2c = Curl_dyn_addn(dq,(void *)len_local,1);
      }
      else {
        builtin_strncpy(acStack_48,"01234",5);
        out[0] = '5';
        out[1] = '6';
        out[2] = '7';
        local_4b = 0x25;
        local_49 = '\0';
        if (p_Stack_28 == (_Bool *)0x0) {
          if (*(char *)len_local == '/') {
            local_2c = Curl_dyn_addn(dq,(void *)len_local,1);
          }
          else {
LAB_00156b14:
            local_4b = CONCAT11(acStack_48[(int)(uint)*(byte *)len_local >> 4],0x25);
            local_49 = acStack_48[(int)((int)*(char *)len_local & 0xf)];
            local_2c = Curl_dyn_addn(dq,&local_4b,3);
          }
        }
        else {
          if (*(char *)len_local != '=') goto LAB_00156b14;
          local_2c = Curl_dyn_addn(dq,(void *)len_local,1);
          *p_Stack_28 = true;
        }
      }
    }
    else {
      local_2c = Curl_dyn_addn(dq,(void *)len_local,1);
    }
    len_local = len_local + 1;
    dq_local = (dynbuf *)((long)&dq_local[-1].toobig + 7);
  } while( true );
}

Assistant:

static CURLcode canon_string(const char *q, size_t len,
                             struct dynbuf *dq, bool *found_equals)
{
  CURLcode result = CURLE_OK;

  for(; len && !result; q++, len--) {
    if(ISALNUM(*q))
      result = Curl_dyn_addn(dq, q, 1);
    else {
      switch(*q) {
      case '-':
      case '.':
      case '_':
      case '~':
        /* allowed as-is */
        result = Curl_dyn_addn(dq, q, 1);
        break;
      case '%':
        /* uppercase the following if hexadecimal */
        if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
          char tmp[3]="%";
          tmp[1] = Curl_raw_toupper(q[1]);
          tmp[2] = Curl_raw_toupper(q[2]);
          result = Curl_dyn_addn(dq, tmp, 3);
          q += 2;
          len -= 2;
        }
        else
          /* '%' without a following two-digit hex, encode it */
          result = Curl_dyn_addn(dq, "%25", 3);
        break;
      default: {
        const char hex[] = "0123456789ABCDEF";
        char out[3]={'%'};

        if(!found_equals) {
          /* if found_equals is NULL assuming, been in path */
          if(*q == '/') {
            /* allowed as if */
            result = Curl_dyn_addn(dq, q, 1);
            break;
          }
        }
        else {
          /* allowed as-is */
          if(*q == '=') {
            result = Curl_dyn_addn(dq, q, 1);
            *found_equals = TRUE;
            break;
          }
        }
        /* URL encode */
        out[1] = hex[((unsigned char)*q) >> 4];
        out[2] = hex[*q & 0xf];
        result = Curl_dyn_addn(dq, out, 3);
        break;
      }
      }
    }
  }
  return result;
}